

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O3

int Gia_ManBuiltInSimCheckOver(Gia_Man_t *p,int iLit0,int iLit1)

{
  uint uVar1;
  uint uVar2;
  word *pwVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  
  if (iLit0 < 0) {
LAB_002262c9:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  uVar1 = p->nSimWords;
  uVar4 = (ulong)uVar1;
  uVar5 = ((uint)iLit0 >> 1) * uVar1;
  if (-1 < (int)uVar5) {
    uVar2 = p->vSims->nSize;
    if ((int)uVar5 < (int)uVar2) {
      if (iLit1 < 0) goto LAB_002262c9;
      uVar7 = ((uint)iLit1 >> 1) * uVar1;
      if ((-1 < (int)uVar7) && (uVar7 < uVar2)) {
        pwVar3 = p->vSims->pArray;
        if ((p->fBuiltInSim == 0) && (p->fIncrSim == 0)) {
          __assert_fail("p->fBuiltInSim || p->fIncrSim",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSim.c"
                        ,0x35f,"int Gia_ManBuiltInSimCheckOver(Gia_Man_t *, int, int)");
        }
        if ((iLit0 & 1U) == 0) {
          if ((iLit1 & 1U) == 0) {
            if (0 < (int)uVar1) {
              uVar6 = 0;
              do {
                if ((pwVar3[uVar5 + uVar6] & pwVar3[uVar7 + uVar6]) != 0) {
                  return 1;
                }
                uVar6 = uVar6 + 1;
              } while (uVar4 != uVar6);
            }
          }
          else if (0 < (int)uVar1) {
            uVar6 = 0;
            do {
              if ((pwVar3[uVar5 + uVar6] & ~pwVar3[uVar7 + uVar6]) != 0) {
                return 1;
              }
              uVar6 = uVar6 + 1;
            } while (uVar4 != uVar6);
          }
        }
        else if ((iLit1 & 1U) == 0) {
          if (0 < (int)uVar1) {
            uVar6 = 0;
            do {
              if ((pwVar3[uVar7 + uVar6] & ~pwVar3[uVar5 + uVar6]) != 0) {
                return 1;
              }
              uVar6 = uVar6 + 1;
            } while (uVar4 != uVar6);
          }
        }
        else if (0 < (int)uVar1) {
          uVar6 = 0;
          do {
            if ((pwVar3[uVar7 + uVar6] | pwVar3[uVar5 + uVar6]) != 0xffffffffffffffff) {
              return 1;
            }
            uVar6 = uVar6 + 1;
          } while (uVar4 != uVar6);
        }
        return 0;
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
}

Assistant:

int Gia_ManBuiltInSimCheckOver( Gia_Man_t * p, int iLit0, int iLit1 )
{
    word * pInfo0 = Gia_ManBuiltInData( p, Abc_Lit2Var(iLit0) );
    word * pInfo1 = Gia_ManBuiltInData( p, Abc_Lit2Var(iLit1) ); int w;
    assert( p->fBuiltInSim || p->fIncrSim );

//    printf( "%d %d\n", Abc_LitIsCompl(iLit0), Abc_LitIsCompl(iLit1) );
//    Extra_PrintBinary( stdout, pInfo0, 64*p->nSimWords ); printf( "\n" );
//    Extra_PrintBinary( stdout, pInfo1, 64*p->nSimWords ); printf( "\n" );
//    printf( "\n" );

    if ( Abc_LitIsCompl(iLit0) )
    {
        if (  Abc_LitIsCompl(iLit1) )
        {
            for ( w = 0; w < p->nSimWords; w++ )
                if ( ~pInfo0[w] & ~pInfo1[w] )
                    return 1;
        }
        else 
        {
            for ( w = 0; w < p->nSimWords; w++ )
                if ( ~pInfo0[w] & pInfo1[w] )
                    return 1;
        }
    }
    else 
    {
        if (  Abc_LitIsCompl(iLit1) )
        {
            for ( w = 0; w < p->nSimWords; w++ )
                if ( pInfo0[w] & ~pInfo1[w] )
                    return 1;
        }
        else 
        {
            for ( w = 0; w < p->nSimWords; w++ )
                if ( pInfo0[w] & pInfo1[w] )
                    return 1;
        }
    }
    return 0;
}